

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O2

uint nullcDebugGetReversedStackDataBase(uint framePos)

{
  long lVar1;
  uint uVar2;
  uint instruction;
  ExternFuncInfo *pEVar3;
  uint functionCount;
  uint uVar4;
  uint frame;
  uint *puVar5;
  
  uVar2 = nullcDebugGetStackFrameCount();
  uVar4 = 0;
  if (framePos <= uVar2) {
    uVar4 = 0;
    frame = 0;
    while( true ) {
      instruction = nullcDebugEnumStackFrame(frame);
      lVar1 = NULLC::linker;
      if ((instruction == 0) || (uVar2 - framePos == frame)) break;
      if (NULLC::linker == 0) {
        functionCount = 0;
        pEVar3 = (ExternFuncInfo *)0x0;
      }
      else {
        functionCount = *(uint *)(NULLC::linker + 0x24c);
        pEVar3 = *(ExternFuncInfo **)(NULLC::linker + 0x240);
      }
      pEVar3 = nullcDebugConvertAddressToFunction(instruction,pEVar3,functionCount);
      puVar5 = (uint *)(lVar1 + 0x750);
      if (pEVar3 != (ExternFuncInfo *)0x0) {
        puVar5 = &pEVar3->stackSize;
      }
      uVar4 = uVar4 + (*puVar5 + 0xf & 0xfffffff0);
      frame = frame + 1;
    }
  }
  return uVar4;
}

Assistant:

unsigned nullcDebugGetReversedStackDataBase(unsigned framePos)
{
	using namespace NULLC;

	unsigned callStackSize = nullcDebugGetStackFrameCount();

	if(framePos > callStackSize)
		return 0;

	unsigned targetFrame = callStackSize - framePos;

	unsigned offset = 0;

	unsigned currentFrame = 0;
	while(unsigned instruction = nullcDebugEnumStackFrame(currentFrame++))
	{
		if(targetFrame == 0)
			return offset;

		targetFrame--;

		unsigned functionCount = 0;
		ExternFuncInfo *functions = nullcDebugFunctionInfo(&functionCount);

		if(ExternFuncInfo *targetFunction = nullcDebugConvertAddressToFunction(instruction, functions, functionCount))
			offset += (targetFunction->stackSize + 0xf) & ~0xf;
		else
			offset += (linker->globalVarSize + 0xf) & ~0xf;
	}

	return offset;
}